

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnceReduction.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_22::Optimizer::doWalkFunction(Optimizer *this,Function *func)

{
  bool bVar1;
  size_type __new_size;
  reference this_00;
  pointer this_01;
  Optimizer *this_02;
  reference pvVar2;
  reference pvVar3;
  reference ppEVar4;
  GlobalSet *pGVar5;
  atomic *this_03;
  Call *pCVar6;
  IString *this_04;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  reference pNVar9;
  vector<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>_>_>_>
  *blocks;
  undefined1 auStack_138 [8];
  Name globalName;
  _Node_iterator_base<wasm::Name,_true> local_120;
  iterator __end6;
  iterator __begin6;
  mapped_type *__range6;
  undefined1 auStack_f8 [8];
  Name target;
  Call *call;
  GlobalSet *set;
  anon_class_24_3_54df3a52 optimizeOnce;
  Expression *expr;
  iterator __end3;
  iterator __begin3;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range3;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *exprs;
  value_type parent;
  value_type *onceGlobalsWritten;
  BasicBlock *block;
  Index i;
  size_type numBlocks;
  vector<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
  onceGlobalsWrittenVec;
  DomTree<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>
  domTree;
  Function *func_local;
  Optimizer *this_local;
  
  CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
  ::doWalkFunction(&(this->
                    super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                    ).
                    super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                   ,func);
  bVar1 = std::
          vector<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>_>_>_>
          ::empty(&(this->
                   super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                   ).
                   super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                   .basicBlocks);
  if (!bVar1) {
    blocks = &(this->
              super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
              ).
              super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
              .basicBlocks;
    DomTree<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>
    ::DomTree((DomTree<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>
               *)&onceGlobalsWrittenVec.
                  super__Vector_base<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,blocks);
    std::
    vector<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
    ::vector((vector<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
              *)&numBlocks);
    __new_size = std::
                 vector<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>_>_>_>
                 ::size(blocks);
    std::
    vector<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
    ::resize((vector<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
              *)&numBlocks,__new_size);
    for (block._0_4_ = 0; (uint)block < __new_size; block._0_4_ = (uint)block + 1) {
      this_00 = std::
                vector<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>_>_>_>
                ::operator[](&(this->
                              super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                              ).
                              super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                              .basicBlocks,(ulong)(uint)block);
      this_01 = std::
                unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>_>
                ::get(this_00);
      this_02 = (Optimizer *)
                std::
                vector<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
                ::operator[]((vector<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
                              *)&numBlocks,(ulong)(uint)block);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &onceGlobalsWrittenVec.
                           super__Vector_base<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(uint)block);
      if (*pvVar2 == 0xffffffff) {
        if ((uint)block == 0) goto LAB_01f129c2;
      }
      else {
        pvVar3 = std::
                 vector<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
                 ::operator[]((vector<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
                               *)&numBlocks,(ulong)*pvVar2);
        std::
        unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
        ::operator=((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)this_02,pvVar3);
LAB_01f129c2:
        __end3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin
                           ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                            this_01);
        expr = (Expression *)
               std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end
                         ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this_01
                         );
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                           *)&expr), bVar1) {
          ppEVar4 = __gnu_cxx::
                    __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                    ::operator*(&__end3);
          optimizeOnce.expr = (Expression **)*ppEVar4;
          optimizeOnce.onceGlobalsWritten = (value_type *)&optimizeOnce.expr;
          set = (GlobalSet *)this;
          optimizeOnce.this = this_02;
          pGVar5 = Expression::dynCast<wasm::GlobalSet>((Expression *)optimizeOnce.expr);
          if (pGVar5 == (GlobalSet *)0x0) {
            pCVar6 = Expression::dynCast<wasm::Call>((Expression *)optimizeOnce.expr);
            if (pCVar6 == (Call *)0x0) {
              handle_unreachable("invalid expr",
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OnceReduction.cpp"
                                 ,0x149);
            }
            auStack_f8 = (undefined1  [8])(pCVar6->target).super_IString.str._M_len;
            target.super_IString.str._M_len = (size_t)(pCVar6->target).super_IString.str._M_str;
            this_04 = &std::
                       unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                       ::at(&this->optInfo->onceFuncs,(key_type *)auStack_f8)->super_IString;
            bVar1 = IString::is(this_04);
            if (bVar1) {
              bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::empty
                                (&(pCVar6->operands).
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                );
              if (!bVar1) {
                __assert_fail("call->operands.empty()",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OnceReduction.cpp"
                              ,0x13f,
                              "void wasm::(anonymous namespace)::Optimizer::doWalkFunction(Function *)"
                             );
              }
              pmVar7 = std::
                       unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                       ::at(&this->optInfo->onceFuncs,(key_type *)auStack_f8);
              doWalkFunction::anon_class_24_3_54df3a52::operator()
                        ((anon_class_24_3_54df3a52 *)&set,(Name)(pmVar7->super_IString).str);
            }
            else {
              pmVar8 = std::
                       unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                       ::at(&this->optInfo->onceGlobalsSetInFuncs,(key_type *)auStack_f8);
              __end6 = std::
                       unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                       ::begin(pmVar8);
              local_120._M_cur =
                   (__node_type *)
                   std::
                   unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   ::end(pmVar8);
              while (bVar1 = std::__detail::operator!=
                                       (&__end6.super__Node_iterator_base<wasm::Name,_true>,
                                        &local_120), bVar1) {
                pNVar9 = std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end6);
                auStack_138 = (undefined1  [8])(pNVar9->super_IString).str._M_len;
                globalName.super_IString.str._M_len = (size_t)(pNVar9->super_IString).str._M_str;
                std::
                unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                          *)this_02,(value_type *)auStack_138);
                std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end6);
              }
            }
          }
          else {
            this_03 = (atomic *)
                      std::
                      unordered_map<wasm::Name,_std::atomic<bool>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>_>
                      ::at(&this->optInfo->onceGlobals,&pGVar5->name);
            bVar1 = std::atomic::operator_cast_to_bool(this_03);
            if (bVar1) {
              bVar1 = Expression::is<wasm::Const>(pGVar5->value);
              if (!bVar1) {
                __assert_fail("set->value->is<Const>()",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OnceReduction.cpp"
                              ,0x138,
                              "void wasm::(anonymous namespace)::Optimizer::doWalkFunction(Function *)"
                             );
              }
              doWalkFunction::anon_class_24_3_54df3a52::operator()
                        ((anon_class_24_3_54df3a52 *)&set,(Name)(pGVar5->name).super_IString.str);
            }
          }
          __gnu_cxx::
          __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          ::operator++(&__end3);
        }
      }
    }
    pvVar3 = std::
             vector<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
             ::operator[]((vector<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
                           *)&numBlocks,0);
    pmVar8 = std::
             unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
             ::operator[](&this->optInfo->newOnceGlobalsSetInFuncs,(key_type *)func);
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::operator=(pmVar8,pvVar3);
    std::
    vector<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
    ::~vector((vector<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
               *)&numBlocks);
    DomTree<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>
    ::~DomTree((DomTree<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>
                *)&onceGlobalsWrittenVec.
                   super__Vector_base<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::allocator<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    using Parent =
      WalkerPass<CFGWalker<Optimizer, Visitor<Optimizer>, BlockInfo>>;

    // Walk the function to builds the CFG.
    Parent::doWalkFunction(func);
    if (basicBlocks.empty()) {
      return;
    }

    // Build a dominator tree, which then tells us what to remove: if a call
    // appears in block A, then we do not need to make any calls in any blocks
    // dominated by A.
    DomTree<Parent::BasicBlock> domTree(basicBlocks);

    // Perform the work by going through the blocks in reverse postorder and
    // filling out which "once" globals have been written to.

    // Each index in this vector is the set of "once" globals written to in the
    // basic block with the same index.
    std::vector<std::unordered_set<Name>> onceGlobalsWrittenVec;
    auto numBlocks = basicBlocks.size();
    onceGlobalsWrittenVec.resize(numBlocks);

    for (Index i = 0; i < numBlocks; i++) {
      auto* block = basicBlocks[i].get();

      // Note that we take a reference here, which is how the data we accumulate
      // ends up stored. The blocks we dominate will see it later.
      auto& onceGlobalsWritten = onceGlobalsWrittenVec[i];

      // Note information from our immediate dominator.
      // TODO: we could also intersect information from all of our preds.
      auto parent = domTree.iDoms[i];
      if (parent == domTree.nonsense) {
        // This is either the entry node (which we need to process), or an
        // unreachable block (which we do not need to process - we leave that to
        // DCE).
        if (i > 0) {
          continue;
        }
      } else {
        // This block has an immediate dominator, so we know that everything
        // written to there can be assumed written.
        onceGlobalsWritten = onceGlobalsWrittenVec[parent];
      }

      // Process the block's expressions.
      auto& exprs = block->contents.exprs;
      for (auto* expr : exprs) {
        // Given the name of a "once" global that is written by this
        // instruction, optimize.
        auto optimizeOnce = [&](Name globalName) {
          assert(optInfo.onceGlobals.at(globalName));
          auto res = onceGlobalsWritten.emplace(globalName);
          if (!res.second) {
            // This global has already been written, so this expr is not needed,
            // regardless of whether it is a global.set or a call.
            //
            // Note that assertions below verify that there are no children that
            // we need to keep around, and so we can just nop the entire node.
            ExpressionManipulator::nop(expr);
          } else {
            // From here on, this global is set, hopefully allowing us to
            // optimize away others.
          }
        };

        if (auto* set = expr->dynCast<GlobalSet>()) {
          if (optInfo.onceGlobals.at(set->name)) {
            // This global is written.
            assert(set->value->is<Const>());
            optimizeOnce(set->name);
          }
        } else if (auto* call = expr->dynCast<Call>()) {
          auto target = call->target;
          if (optInfo.onceFuncs.at(target).is()) {
            // The global used by the "once" func is written.
            assert(call->operands.empty());
            optimizeOnce(optInfo.onceFuncs.at(target));
            continue;
          }

          // Note as written all globals the called function is known to write.
          for (auto globalName : optInfo.onceGlobalsSetInFuncs.at(target)) {
            onceGlobalsWritten.insert(globalName);
          }
        } else {
          WASM_UNREACHABLE("invalid expr");
        }
      }
    }

    // As a result of the above optimization, we know which "once" globals are
    // definitely written in this function. Regardless of whether this is a
    // "once" function itself, that set of globals can be used in further
    // optimizations, as any call to this function must set those.
    // TODO: Aside from the entry block, we could intersect all the exit blocks.
    optInfo.newOnceGlobalsSetInFuncs[func->name] =
      std::move(onceGlobalsWrittenVec[0]);
  }